

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_regexp_get_source(JSContext *ctx,JSValue this_val)

{
  long lVar1;
  JSString *pJVar2;
  BOOL BVar3;
  JSRegExp *pJVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint c;
  uint32_t c_00;
  bool bVar11;
  JSValue JVar12;
  StringBuffer b_s;
  
  if ((int)this_val.tag == -1) {
    BVar3 = js_same_value(ctx,this_val,ctx->class_proto[0x12]);
    if (BVar3 == 0) {
      pJVar4 = js_get_regexp(ctx,this_val,1);
      if (pJVar4 == (JSRegExp *)0x0) goto LAB_00135107;
      pJVar2 = pJVar4->pattern;
      uVar7 = *(uint *)&pJVar2->field_0x4 & 0x7fffffff;
      if (uVar7 == 0) goto LAB_001350e1;
      string_buffer_init2(ctx,&b_s,uVar7,*(uint *)&pJVar2->field_0x4 >> 0x1f);
      uVar7 = *(uint *)&pJVar2->field_0x4 & 0x7fffffff;
      iVar9 = 0;
      bVar11 = false;
      while (iVar9 < (int)uVar7) {
        lVar6 = (long)iVar9;
        iVar8 = (int)*(undefined8 *)&pJVar2->field_0x4;
        if (iVar8 < 0) {
          c_00 = (uint32_t)*(ushort *)((long)&pJVar2[1].header.ref_count + lVar6 * 2);
        }
        else {
          c_00 = (uint32_t)*(byte *)((long)&pJVar2[1].header.ref_count + lVar6);
        }
        lVar1 = lVar6 + 1;
        iVar10 = (int)lVar1;
        if (c_00 == 10) {
          c_00 = 0x5c;
          c = 0x6e;
          iVar9 = iVar10;
        }
        else if (c_00 == 0xd) {
          c_00 = 0x5c;
          c = 0x72;
          iVar9 = iVar10;
        }
        else if (c_00 == 0x2f) {
          if (bVar11) {
            c_00 = 0x2f;
LAB_0013520f:
            c = 0xffffffff;
            goto LAB_0013524f;
          }
          bVar11 = false;
          c_00 = 0x5c;
          c = 0x2f;
          iVar9 = iVar10;
        }
        else if (c_00 == 0x5b) {
          if ((bVar11) || ((int)uVar7 <= iVar10)) {
            c_00 = 0x5b;
            goto LAB_0013520f;
          }
          if (iVar8 < 0) {
            bVar11 = *(short *)((long)&pJVar2[1].header.ref_count + lVar6 * 2 + 2) == 0x5d;
          }
          else {
            bVar11 = *(char *)((long)&pJVar2[1].header.ref_count + lVar1) == ']';
          }
          iVar9 = iVar9 + 2;
          if (!bVar11) {
            iVar9 = iVar10;
          }
          iVar10 = iVar9;
          c = -(uint)!bVar11 | 0x5d;
          c_00 = 0x5b;
LAB_0013524f:
          bVar11 = true;
          iVar9 = iVar10;
        }
        else {
          if (c_00 == 0x5d) {
            bVar11 = false;
            c_00 = 0x5d;
          }
          else if (c_00 == 0x5c) {
            if (iVar10 < (int)uVar7) {
              if (iVar8 < 0) {
                c = (uint)*(ushort *)((long)&pJVar2[1].header.ref_count + lVar6 * 2 + 2);
              }
              else {
                c = (uint)*(byte *)((long)&pJVar2[1].header.ref_count + lVar1);
              }
              c_00 = 0x5c;
              iVar9 = iVar9 + 2;
              goto LAB_00135253;
            }
            c_00 = 0x5c;
          }
          c = 0xffffffff;
          iVar9 = iVar10;
        }
LAB_00135253:
        string_buffer_putc16(&b_s,c_00);
        if (-1 < (int)c) {
          string_buffer_putc16(&b_s,c);
        }
      }
      JVar12 = string_buffer_end(&b_s);
    }
    else {
LAB_001350e1:
      JVar12 = JS_NewString(ctx,"(?:)");
    }
    uVar5 = (ulong)JVar12.u.ptr & 0xffffffff00000000;
  }
  else {
    JS_ThrowTypeErrorNotAnObject(ctx);
LAB_00135107:
    JVar12 = (JSValue)(ZEXT816(6) << 0x40);
    uVar5 = 0;
  }
  JVar12.u.ptr = (void *)(JVar12.u._0_4_ | uVar5);
  return JVar12;
}

Assistant:

static JSValue js_regexp_get_source(JSContext *ctx, JSValueConst this_val)
{
    JSRegExp *re;
    JSString *p;
    StringBuffer b_s, *b = &b_s;
    int i, n, c, c2, bra;

    if (JS_VALUE_GET_TAG(this_val) != JS_TAG_OBJECT)
        return JS_ThrowTypeErrorNotAnObject(ctx);

    if (js_same_value(ctx, this_val, ctx->class_proto[JS_CLASS_REGEXP]))
        goto empty_regex;

    re = js_get_regexp(ctx, this_val, TRUE);
    if (!re)
        return JS_EXCEPTION;

    p = re->pattern;

    if (p->len == 0) {
    empty_regex:
        return JS_NewString(ctx, "(?:)");
    }    
    string_buffer_init2(ctx, b, p->len, p->is_wide_char);

    /* Escape '/' and newline sequences as needed */
    bra = 0;
    for (i = 0, n = p->len; i < n;) {
        c2 = -1;
        switch (c = string_get(p, i++)) {
        case '\\':
            if (i < n)
                c2 = string_get(p, i++);
            break;
        case ']':
            bra = 0;
            break;
        case '[':
            if (!bra) {
                if (i < n && string_get(p, i) == ']')
                    c2 = string_get(p, i++);
                bra = 1;
            }
            break;
        case '\n':
            c = '\\';
            c2 = 'n';
            break;
        case '\r':
            c = '\\';
            c2 = 'r';
            break;
        case '/':
            if (!bra) {
                c = '\\';
                c2 = '/';
            }
            break;
        }
        string_buffer_putc16(b, c);
        if (c2 >= 0)
            string_buffer_putc16(b, c2);
    }
    return string_buffer_end(b);
}